

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

char * __thiscall
fmt::v10::detail::format_string_checker<char,_int,_unsigned_long>::on_format_specs
          (format_string_checker<char,_int,_unsigned_long> *this,int id,char *begin,char *param_3)

{
  char *local_38;
  char *param_3_local;
  char *begin_local;
  int id_local;
  format_string_checker<char,_int,_unsigned_long> *this_local;
  
  basic_format_parse_context<char>::advance_to
            (&(this->context_).super_basic_format_parse_context<char>,begin);
  local_38 = begin;
  if ((-1 < id) && (id < 2)) {
    local_38 = (*this->parse_funcs_[id])(&this->context_);
  }
  return local_38;
}

Assistant:

FMT_CONSTEXPR auto on_format_specs(int id, const Char* begin, const Char*)
      -> const Char* {
    context_.advance_to(begin);
    // id >= 0 check is a workaround for gcc 10 bug (#2065).
    return id >= 0 && id < num_args ? parse_funcs_[id](context_) : begin;
  }